

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

int SaveHobeta(path *fname,char *fhobname,aint start,aint length)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  char *badValueMessage;
  bool local_a1;
  int result;
  string local_78;
  FILE *local_58;
  FILE *ff;
  int chk;
  char *ext;
  byte local_38 [4];
  int i;
  uchar header [17];
  aint length_local;
  aint start_local;
  char *fhobname_local;
  path *fname_local;
  
  unique0x100001ee = length;
  if (0x10000 < length + start) {
    stack0xffffffffffffffe0 = -1;
  }
  if (stack0xffffffffffffffe0 < 1) {
    register0x00000000 = 0x10000 - start;
  }
  memset(local_38,0x20,9);
  sVar2 = strlen(fhobname);
  ext._4_4_ = (int)sVar2;
  if (((1 < ext._4_4_) && (_chk = strrchr(fhobname,0x2e), _chk != (char *)0x0)) && (_chk[1] != '\0')
     ) {
    header[0] = _chk[1];
    ext._4_4_ = (int)_chk - (int)fhobname;
  }
  ff._4_4_ = 8;
  piVar3 = std::min<int>((int *)((long)&ext + 4),(int *)((long)&ff + 4));
  memcpy(local_38,fhobname,(long)*piVar3);
  header[3] = (uchar)stack0xffffffffffffffe0;
  header[4] = (uchar)((uint)stack0xffffffffffffffe0 >> 8);
  if (header[0] == 'B') {
    header[1] = header[3];
    header[2] = header[4];
  }
  else {
    header[1] = (uchar)start;
    header[2] = (uchar)((uint)start >> 8);
  }
  header[5] = '\0';
  if (header[3] == '\0') {
    header[6] = header[4];
  }
  else {
    header[6] = header[4] + '\x01';
  }
  register0x00000000 = (uint)header[6] << 8;
  ff._0_4_ = 0;
  for (ext._4_4_ = 0; ext._4_4_ < 0xf; ext._4_4_ = ext._4_4_ + 1) {
    ff._0_4_ = (int)ff + (uint)local_38[ext._4_4_] * 0x101 + ext._4_4_;
  }
  header[7] = (uchar)(int)ff;
  header[8] = (uchar)((uint)(int)ff >> 8);
  local_58 = (FILE *)SJ_fopen(fname,"wb");
  if (local_58 == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_78,fname);
    badValueMessage = (char *)std::__cxx11::string::c_str();
    Error("opening file for write",badValueMessage,FATAL);
    std::__cxx11::string::~string((string *)&local_78);
  }
  sVar2 = fwrite(local_38,1,0x11,local_58);
  local_a1 = false;
  if (sVar2 == 0x11) {
    iVar1 = SaveRAM((FILE *)local_58,start,stack0xffffffffffffffe0);
    local_a1 = iVar1 != 0;
  }
  fclose(local_58);
  return (uint)local_a1;
}

Assistant:

int SaveHobeta(const std::filesystem::path & fname, const char* fhobname, aint start, aint length) {
	unsigned char header[0x11];
	int i;

	if (length + start > 0x10000) {
		length = -1;
	}
	if (length <= 0) {
		length = 0x10000 - start;
	}

	memset(header,' ',9);
	i = strlen(fhobname);
	if (i > 1)
	{
		const char *ext = strrchr(fhobname, '.');
		if (ext && ext[1])
		{
			header[8] = ext[1];
			i = ext-fhobname;
		}
	}
	memcpy(header, fhobname, std::min(i,8));

	if (header[8] == 'B')	{
		header[0x09] = (unsigned char)(length & 0xff);
		header[0x0a] = (unsigned char)(length >> 8);
	} else	{
		header[0x09] = (unsigned char)(start & 0xff);
		header[0x0a] = (unsigned char)(start >> 8);
	}

	header[0x0b] = (unsigned char)(length & 0xff);
	header[0x0c] = (unsigned char)(length >> 8);
	header[0x0d] = 0;
	if (header[0x0b] == 0) {
		header[0x0e] = header[0x0c];
	} else {
		header[0x0e] = header[0x0c] + 1;
	}
	length = header[0x0e] * 0x100;
	int chk = 0;
	for (i = 0; i <= 14; chk = chk + (header[i] * 257) + i,i++) {
		;
	}
	header[0x0f] = (unsigned char)(chk & 0xff);
	header[0x10] = (unsigned char)(chk >> 8);

	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) {
		Error("opening file for write", fname.string().c_str(), FATAL);
	}

	int result = (17 == fwrite(header, 1, 17, ff)) && SaveRAM(ff, start, length);
	fclose(ff);
	return result;
}